

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::push_front
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *v)

{
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar1;
  undefined4 uVar2;
  uint uVar3;
  ImGuiStoragePair *pIVar4;
  uint uVar5;
  long lVar6;
  
  uVar3 = this->Size;
  if (uVar3 == 0) {
    if (this->Capacity == 0) {
      pIVar4 = (ImGuiStoragePair *)ImGui::MemAlloc(0x80);
      if (this->Data != (ImGuiStoragePair *)0x0) {
        memcpy(pIVar4,this->Data,(long)this->Size << 4);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar4;
      this->Capacity = 8;
      lVar6 = (long)this->Size;
    }
    else {
      pIVar4 = this->Data;
      lVar6 = 0;
    }
    pIVar4 = pIVar4 + lVar6;
  }
  else {
    if ((int)uVar3 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,
                    "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
                   );
    }
    if (uVar3 == this->Capacity) {
      uVar5 = (uVar3 >> 1) + uVar3;
      if (uVar5 <= uVar3 + 1) {
        uVar5 = uVar3 + 1;
      }
      pIVar4 = (ImGuiStoragePair *)ImGui::MemAlloc((ulong)uVar5 << 4);
      if (this->Data != (ImGuiStoragePair *)0x0) {
        memcpy(pIVar4,this->Data,(long)this->Size << 4);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar4;
      this->Capacity = uVar5;
      uVar3 = this->Size;
      if ((int)uVar3 < 1) goto LAB_00133300;
    }
    else {
      pIVar4 = this->Data;
    }
    memmove(pIVar4 + 1,pIVar4,(ulong)uVar3 << 4);
    pIVar4 = this->Data;
  }
LAB_00133300:
  uVar2 = *(undefined4 *)&v->field_0x4;
  aVar1 = v->field_1;
  pIVar4->key = v->key;
  *(undefined4 *)&pIVar4->field_0x4 = uVar2;
  pIVar4->field_1 = aVar1;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }